

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

bool __thiscall
llvm::yaml::Scanner::scanBlockScalarIndent
          (Scanner *this,uint BlockIndent,uint BlockExitIndent,bool *IsDone)

{
  iterator pcVar1;
  uint uVar2;
  uint uVar3;
  char *Position;
  Twine TStack_48;
  
  uVar2 = this->Column;
  Position = this->Current;
  uVar3 = uVar2;
  if (uVar2 < BlockIndent) {
    do {
      uVar3 = uVar2;
      if ((Position == this->End) || (*Position != ' ')) break;
      Position = Position + 1;
      this->Current = Position;
      uVar2 = uVar2 + 1;
      this->Column = uVar2;
      uVar3 = BlockIndent;
    } while (BlockIndent != uVar2);
  }
  pcVar1 = skip_nb_char(this,Position);
  if (pcVar1 == Position) {
    return true;
  }
  if (BlockExitIndent < uVar3) {
    if (BlockIndent <= uVar3) {
      return true;
    }
    if ((Position == this->End) || (*Position != '#')) {
      Twine::Twine(&TStack_48,"A text line is less indented than the block scalar");
      setError(this,&TStack_48,this->Current);
      return false;
    }
  }
  *IsDone = true;
  return true;
}

Assistant:

bool Scanner::scanBlockScalarIndent(unsigned BlockIndent,
                                    unsigned BlockExitIndent, bool &IsDone) {
  // Skip the indentation.
  while (Column < BlockIndent) {
    auto I = skip_s_space(Current);
    if (I == Current)
      break;
    Current = I;
    ++Column;
  }

  if (skip_nb_char(Current) == Current)
    return true;

  if (Column <= BlockExitIndent) { // End of the block literal.
    IsDone = true;
    return true;
  }

  if (Column < BlockIndent) {
    if (Current != End && *Current == '#') { // Trailing comment.
      IsDone = true;
      return true;
    }
    setError("A text line is less indented than the block scalar", Current);
    return false;
  }
  return true; // A normal text line.
}